

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::TraverseSchema::isIdentityConstraintName(TraverseSchema *this,XMLCh *name)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  XMLCh *pXVar4;
  long lVar5;
  short *psVar6;
  
  if (name != L"key") {
    if (name == (XMLCh *)0x0) {
      psVar6 = &SchemaSymbols::fgELT_KEY;
LAB_003323fd:
      if (name == L"keyref") {
        return true;
      }
      if (*psVar6 == 0) {
        return true;
      }
    }
    else {
      lVar5 = 0;
      do {
        psVar6 = (short *)((long)name + lVar5);
        if (*psVar6 == 0) {
          psVar6 = (short *)((long)&SchemaSymbols::fgELT_KEY + lVar5);
          goto LAB_003323fd;
        }
        psVar1 = (short *)((long)&SchemaSymbols::fgELT_KEY + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar6 == *psVar1);
      if (name == L"keyref") {
        return true;
      }
    }
    if (name == (XMLCh *)0x0) {
      psVar6 = &SchemaSymbols::fgELT_KEYREF;
LAB_0033244b:
      if ((name != L"unique") && (*psVar6 != 0)) goto LAB_0033245a;
    }
    else {
      lVar5 = 0;
      do {
        psVar6 = (short *)((long)name + lVar5);
        if (*psVar6 == 0) {
          psVar6 = (short *)((long)&SchemaSymbols::fgELT_KEYREF + lVar5);
          goto LAB_0033244b;
        }
        psVar1 = (short *)((long)&SchemaSymbols::fgELT_KEYREF + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar6 == *psVar1);
      if (name != L"unique") {
LAB_0033245a:
        pXVar4 = L"unique";
        if (name != (XMLCh *)0x0) {
          while (XVar2 = *name, XVar2 != L'\0') {
            name = name + 1;
            XVar3 = *pXVar4;
            pXVar4 = pXVar4 + 1;
            if (XVar2 != XVar3) {
              return false;
            }
          }
        }
        return *pXVar4 == L'\0';
      }
    }
  }
  return true;
}

Assistant:

bool TraverseSchema::isIdentityConstraintName(const XMLCh* const name) {

    return (XMLString::equals(name, SchemaSymbols::fgELT_KEY)
            || XMLString::equals(name, SchemaSymbols::fgELT_KEYREF)
            || XMLString::equals(name, SchemaSymbols::fgELT_UNIQUE));
}